

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O2

uint PacketProcessor::Number(uchar b1,uchar b2,uchar b3,uchar b4)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined7 in_register_00000009;
  uint uVar9;
  undefined7 in_register_00000011;
  uint uVar10;
  undefined7 in_register_00000031;
  undefined7 in_register_00000039;
  
  uVar1 = 1;
  uVar2 = CONCAT71(in_register_00000039,b1);
  if ((int)CONCAT71(in_register_00000039,b1) == 0xfe) {
    uVar2 = uVar1;
  }
  uVar3 = CONCAT71(in_register_00000031,b2);
  if ((int)CONCAT71(in_register_00000031,b2) == 0xfe) {
    uVar3 = uVar1;
  }
  uVar4 = CONCAT71(in_register_00000011,b3);
  if ((int)CONCAT71(in_register_00000011,b3) == 0xfe) {
    uVar4 = uVar1;
  }
  uVar5 = CONCAT71(in_register_00000009,b4);
  if ((int)CONCAT71(in_register_00000009,b4) == 0xfe) {
    uVar5 = uVar1;
  }
  uVar6 = 0x7f;
  uVar7 = (uint)(byte)((char)uVar2 - 1);
  if ((char)uVar2 == '\0') {
    uVar7 = uVar6;
  }
  uVar10 = (uint)(byte)((char)uVar3 - 1);
  if ((char)uVar3 == '\0') {
    uVar10 = uVar6;
  }
  uVar9 = (uint)(byte)((char)uVar4 - 1);
  if ((char)uVar4 == '\0') {
    uVar9 = uVar6;
  }
  uVar8 = (uint)(byte)((char)uVar5 - 1);
  if ((char)uVar5 == '\0') {
    uVar8 = uVar6;
  }
  return uVar7 + uVar10 * 0xfd + uVar9 * 0xfa09 + uVar8 * 0xf71ae5;
}

Assistant:

unsigned int PacketProcessor::Number(unsigned char b1, unsigned char b2, unsigned char b3, unsigned char b4)
{
	if (b1 == 254) b1 = 1;
	if (b2 == 254) b2 = 1;
	if (b3 == 254) b3 = 1;
	if (b4 == 254) b4 = 1;

	if (b1 == 0) b1 = 128;
	if (b2 == 0) b2 = 128;
	if (b3 == 0) b3 = 128;
	if (b4 == 0) b4 = 128;

	--b1;
	--b2;
	--b3;
	--b4;

	return (b4*PacketProcessor::MAX3 + b3*PacketProcessor::MAX2 + b2*PacketProcessor::MAX1 + b1);
}